

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O0

REF_STATUS ref_cavity_form_insert2_unconstrain(REF_CAVITY ref_cavity,REF_INT faceid)

{
  REF_CELL ref_cell_00;
  uint uVar1;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_STATUS ref_private_macro_code_rxs;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_INT local_48;
  REF_INT cell;
  REF_INT nodes [4];
  REF_INT face;
  REF_CELL ref_cell;
  REF_GRID ref_grid;
  REF_INT faceid_local;
  REF_CAVITY ref_cavity_local;
  
  ref_cell_00 = ref_cavity->ref_grid->cell[3];
  if ((ulong)ref_cavity->state == 2) {
    ref_cavity->state = REF_CAVITY_UNKNOWN;
    for (nodes[3] = 0; nodes[3] < ref_cavity->maxface; nodes[3] = nodes[3] + 1) {
      if (((-1 < nodes[3]) && (nodes[3] < ref_cavity->maxface)) &&
         (ref_cavity->f2n[nodes[3] * 3] != -1)) {
        local_48 = ref_cavity->f2n[nodes[3] * 3];
        cell = ref_cavity->f2n[nodes[3] * 3 + 1];
        nodes[0] = ref_cavity->f2n[nodes[3] * 3 + 2];
        uVar1 = ref_cell_with(ref_cell_00,&local_48,
                              (REF_INT *)((long)&ref_private_status_reis_ai + 4));
        if ((uVar1 != 0) && (uVar1 != 5)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 0x49f,"ref_cavity_form_insert2_unconstrain",(ulong)uVar1,"find tri");
          return uVar1;
        }
        if (((ref_private_status_reis_ai._4_4_ != -1) &&
            (ref_cell_00->c2n[ref_cell_00->size_per * ref_private_status_reis_ai._4_4_ + 3] ==
             faceid)) &&
           (uVar1 = ref_cavity_add_tri(ref_cavity,ref_private_status_reis_ai._4_4_), uVar1 != 0)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 0x4a1,"ref_cavity_form_insert2_unconstrain",(ulong)uVar1,"tri");
          return uVar1;
        }
      }
    }
    ref_cavity_local._4_4_ = ref_list_erase(ref_cavity->tet_list);
    if (ref_cavity_local._4_4_ == 0) {
      ref_cavity->nface = 0;
      for (nodes[3] = 0; nodes[3] < ref_cavity->maxface; nodes[3] = nodes[3] + 1) {
        ref_cavity->f2n[nodes[3] * 3] = -1;
        ref_cavity->f2n[nodes[3] * 3 + 1] = nodes[3] + 1;
      }
      ref_cavity->f2n[(ref_cavity->maxface + -1) * 3 + 1] = -1;
      ref_cavity->blankface = 0;
      if (ref_cavity->debug != 0) {
        printf(" unconst form tri state %d of %d old %d new\n",(ulong)ref_cavity->state,
               (ulong)(uint)ref_cavity->tri_list->n,(ulong)(uint)ref_cavity->nseg);
      }
      ref_cavity_local._4_4_ = ref_cavity_verify_seg_manifold(ref_cavity);
      if (ref_cavity_local._4_4_ == 0) {
        if (ref_cavity->debug != 0) {
          printf(" unconst manifold tri state %d\n",(ulong)ref_cavity->state);
        }
        if (ref_cavity->state == REF_CAVITY_UNKNOWN) {
          ref_cavity_local._4_4_ = ref_cavity_enlarge_conforming(ref_cavity);
          if (ref_cavity_local._4_4_ == 0) {
            if (ref_cavity->debug != 0) {
              printf(" unconst enlarge tri state %d\n",(ulong)ref_cavity->state);
            }
            if (ref_cavity->state == REF_CAVITY_VISIBLE) {
              ref_cavity->state = REF_CAVITY_UNKNOWN;
              ref_cavity_local._4_4_ = ref_cavity_form_insert2_tet(ref_cavity,faceid);
              if (ref_cavity_local._4_4_ == 0) {
                ref_cavity_local._4_4_ = 0;
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                       ,0x4c3,"ref_cavity_form_insert2_unconstrain",(ulong)ref_cavity_local._4_4_,
                       "form tet ball");
              }
            }
            else {
              ref_cavity_local._4_4_ = 1;
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0x4bb,"ref_cavity_form_insert2_unconstrain",(ulong)ref_cavity_local._4_4_,
                   "enlarge boundary");
          }
        }
        else {
          ref_cavity_local._4_4_ = 1;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0x4b6,"ref_cavity_form_insert2_unconstrain",(ulong)ref_cavity_local._4_4_,
               "ball seg manifold");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
             0x4a6,"ref_cavity_form_insert2_unconstrain",(ulong)ref_cavity_local._4_4_,
             "erase tet list");
    }
  }
  else {
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",0x498,
           "ref_cavity_form_insert2_unconstrain",
           "attempt to unconstrain cavity that is not boundary constrained",2,
           (ulong)ref_cavity->state);
    ref_cavity_local._4_4_ = 1;
  }
  return ref_cavity_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_form_insert2_unconstrain(REF_CAVITY ref_cavity,
                                                       REF_INT faceid) {
  REF_GRID ref_grid = ref_cavity_grid(ref_cavity);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT face, nodes[4], cell;

  REIS(REF_CAVITY_BOUNDARY_CONSTRAINED, ref_cavity_state(ref_cavity),
       "attempt to unconstrain cavity that is not boundary constrained");
  ref_cavity_state(ref_cavity) = REF_CAVITY_UNKNOWN;

  each_ref_cavity_valid_face(ref_cavity, face) {
    nodes[0] = ref_cavity_f2n(ref_cavity, 0, face);
    nodes[1] = ref_cavity_f2n(ref_cavity, 1, face);
    nodes[2] = ref_cavity_f2n(ref_cavity, 2, face);
    RXS(ref_cell_with(ref_cell, nodes, &cell), REF_NOT_FOUND, "find tri");
    if (REF_EMPTY != cell && ref_cell_c2n(ref_cell, 3, cell) == faceid) {
      RSS(ref_cavity_add_tri(ref_cavity, cell), "tri");
    }
  }

  /* undo faces */
  RSS(ref_list_erase(ref_cavity->tet_list), "erase tet list");
  ref_cavity_nface(ref_cavity) = 0;
  for (face = 0; face < ref_cavity_maxface(ref_cavity); face++) {
    ref_cavity_f2n(ref_cavity, 0, face) = REF_EMPTY;
    ref_cavity_f2n(ref_cavity, 1, face) = face + 1;
  }
  ref_cavity_f2n(ref_cavity, 1, ref_cavity_maxface(ref_cavity) - 1) = REF_EMPTY;
  ref_cavity_blankface(ref_cavity) = 0;

  if (ref_cavity_debug(ref_cavity))
    printf(" unconst form tri state %d of %d old %d new\n",
           (int)ref_cavity_state(ref_cavity),
           ref_list_n(ref_cavity_tri_list(ref_cavity)),
           ref_cavity_nseg(ref_cavity));

  /* conform seg */
  RSS(ref_cavity_verify_seg_manifold(ref_cavity), "ball seg manifold");
  if (ref_cavity_debug(ref_cavity))
    printf(" unconst manifold tri state %d\n",
           (int)ref_cavity_state(ref_cavity));
  if (REF_CAVITY_UNKNOWN != ref_cavity_state(ref_cavity)) return REF_FAILURE;
  RSS(ref_cavity_enlarge_conforming(ref_cavity), "enlarge boundary");
  if (ref_cavity_debug(ref_cavity))
    printf(" unconst enlarge tri state %d\n",
           (int)ref_cavity_state(ref_cavity));
  if (REF_CAVITY_VISIBLE != ref_cavity_state(ref_cavity)) return REF_FAILURE;
  ref_cavity_state(ref_cavity) = REF_CAVITY_UNKNOWN;

  /* redo faces */
  RSS(ref_cavity_form_insert2_tet(ref_cavity, faceid), "form tet ball");

  return REF_SUCCESS;
}